

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
string_assertion_test::iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this)

{
  undefined *puVar1;
  bool bVar2;
  char *pcVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_R9;
  AssertionHelper local_1158;
  Fixed local_1128;
  undefined1 local_fa0 [8];
  AssertionResult iutest_ar_8;
  Fixed local_f48;
  undefined1 local_dc0 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_d90;
  Fixed local_d60;
  undefined1 local_bd8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_b80;
  undefined1 local_9f8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_9a0;
  undefined1 local_818 [8];
  AssertionResult iutest_ar_4;
  Fixed local_7c0;
  undefined1 local_638 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5e0;
  undefined1 local_458 [8];
  AssertionResult iutest_ar_2;
  Fixed local_400;
  undefined1 local_278 [8];
  AssertionResult iutest_ar_1;
  Fixed local_220;
  undefined1 local_98 [8];
  AssertionResult iutest_ar;
  wstring local_68 [8];
  String host;
  allocator<wchar_t> local_31;
  undefined1 local_30 [8];
  String test;
  iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this_local;
  
  puVar1 = text<wchar_t>::test;
  test.field_2._8_8_ = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_30,(wchar_t *)puVar1,&local_31);
  std::allocator<wchar_t>::~allocator(&local_31);
  puVar1 = text<wchar_t>::host;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_68,(wchar_t *)puVar1,(allocator<wchar_t> *)&iutest_ar.field_0x27);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_98,(internal *)0x54e8aa,"TestFixture::Text::test",
             (char *)local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             text<wchar_t>::test,(wchar_t *)in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    memset(&local_220,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_220);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_98);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xe8,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_220);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_220);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_278,(internal *)0x54e8aa,"test",(char *)local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    memset(&local_400,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_400);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_278);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xe9,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_400);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_400);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_458,(internal *)"TestFixture::Text::test","host",
             text<wchar_t>::test,(wchar_t *)local_68,in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar2) {
    memset(&local_5e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5e0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_458);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xea,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5e0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_638,(internal *)0x54e8aa,"TestFixture::Text::test",
             (char *)local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             text<wchar_t>::test,(wchar_t *)in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar2) {
    memset(&local_7c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7c0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_638);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xec,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_7c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_818,(internal *)0x54e8aa,"test",(char *)local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar2) {
    memset(&local_9a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9a0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_818);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xed,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_9a0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9a0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_9f8,(internal *)"TestFixture::Text::test","host",
             text<wchar_t>::test,(wchar_t *)local_68,in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
  if (!bVar2) {
    memset(&local_b80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_9f8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xee,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_b80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((AssertionResult *)local_bd8,(internal *)0x54e8aa,"TestFixture::Text::test",
             (char *)local_68,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             text<wchar_t>::test,(wchar_t *)in_R9);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd8);
  if (!bVar2) {
    memset(&local_d60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d60);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_bd8);
    iutest::AssertionHelper::AssertionHelper
              (&local_d90,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xf0,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_d90,&local_d60);
    iutest::AssertionHelper::~AssertionHelper(&local_d90);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d60);
  }
  iutest_ar_7._37_3_ = 0;
  iutest_ar_7._36_1_ = !bVar2;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bd8);
  if (iutest_ar_7._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((AssertionResult *)local_dc0,(internal *)0x54e8aa,"test",(char *)local_68,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_30,in_R9);
    bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
    if (!bVar2) {
      memset(&local_f48,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_f48);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_dc0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_8.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xf1,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_f48);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_f48);
    }
    iutest_ar_7._37_3_ = 0;
    iutest_ar_7._36_1_ = !bVar2;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
    if (iutest_ar_7._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      iutest::internal::
      CmpHelperSTRCASENE<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((AssertionResult *)local_fa0,(internal *)"TestFixture::Text::test","host",
                 text<wchar_t>::test,(wchar_t *)local_68,in_R9);
      bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
      if (!bVar2) {
        memset(&local_1128,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_1128);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_fa0);
        iutest::AssertionHelper::AssertionHelper
                  (&local_1158,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                   ,0xf2,pcVar3,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_1158,&local_1128);
        iutest::AssertionHelper::~AssertionHelper(&local_1158);
        iutest::AssertionHelper::Fixed::~Fixed(&local_1128);
      }
      iutest_ar_7._37_3_ = 0;
      iutest_ar_7._36_1_ = !bVar2;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
      if (iutest_ar_7._36_4_ == 0) {
        iutest_ar_7._36_4_ = 0;
      }
    }
  }
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring((wstring *)local_30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String host = TestFixture::Text::host;
    IUTEST_INFORM_STRCASENE(host, TestFixture::Text::test);
    IUTEST_INFORM_STRCASENE(host, test);
    IUTEST_INFORM_STRCASENE(TestFixture::Text::test, host);

    IUTEST_EXPECT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASENE(host, test);
    IUTEST_EXPECT_STRCASENE(TestFixture::Text::test, host);

    IUTEST_ASSERT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASENE(host, test);
    IUTEST_ASSERT_STRCASENE(TestFixture::Text::test, host);
}